

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool-options.h
# Opt level: O0

ToolOptions * __thiscall
wasm::ToolOptions::addFeature(ToolOptions *this,Feature feature,string *description)

{
  string *psVar1;
  Feature f;
  Feature f_00;
  anon_class_16_2_93cd9da3 local_290;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_280;
  allocator<char> local_259;
  string local_258 [39];
  allocator<char> local_231;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  allocator<char> local_1e9;
  string local_1e8 [32];
  string local_1c8;
  allocator<char> local_1a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  anon_class_16_2_93cd9da3 local_160;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_150;
  allocator<char> local_129;
  string local_128 [39];
  allocator<char> local_101;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  allocator<char> local_b9;
  string local_b8 [32];
  string local_98;
  allocator<char> local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *description_local;
  ToolOptions *pTStack_10;
  Feature feature_local;
  ToolOptions *this_local;
  
  local_20 = description;
  description_local._4_4_ = feature;
  pTStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"--enable-",&local_61);
  FeatureSet::toString_abi_cxx11_(&local_98,(FeatureSet *)(ulong)description_local._4_4_,f);
  std::operator+(&local_40,&local_60,&local_98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b8,"",&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"Enable ",&local_101);
  std::operator+(&local_e0,&local_100,local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_128,"Tool options",&local_129);
  local_160.feature = description_local._4_4_;
  local_160.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::ToolOptions::addFeature(wasm::FeatureSet::Feature,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_1_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_150,&local_160);
  psVar1 = (string *)
           wasm::Options::add((string *)this,(string *)&local_40,local_b8,(string *)&local_e0,
                              (Arguments)local_128,(function *)0x0,SUB81(&local_150,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"--disable-",&local_1a1);
  FeatureSet::toString_abi_cxx11_(&local_1c8,(FeatureSet *)(ulong)description_local._4_4_,f_00);
  std::operator+(&local_180,&local_1a0,&local_1c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1e8,"",&local_1e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"Disable ",&local_231);
  std::operator+(&local_210,&local_230,local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_258,"Tool options",&local_259);
  local_290.feature = description_local._4_4_;
  local_290.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::ToolOptions::addFeature(wasm::FeatureSet::Feature,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_2_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_280,&local_290);
  wasm::Options::add(psVar1,(string *)&local_180,local_1e8,(string *)&local_210,(Arguments)local_258
                     ,(function *)0x0,SUB81(&local_280,0));
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_280);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator(&local_259);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator(&local_231);
  std::__cxx11::string::~string(local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_150);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator(&local_129);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  return this;
}

Assistant:

ToolOptions& addFeature(FeatureSet::Feature feature,
                          const std::string& description) {
    (*this)
      .add(std::string("--enable-") + FeatureSet::toString(feature),
           "",
           std::string("Enable ") + description,
           ToolOptionsCategory,
           Arguments::Zero,
           [this, feature](Options*, const std::string&) {
             enabledFeatures.set(feature, true);
             disabledFeatures.set(feature, false);
           })

      .add(std::string("--disable-") + FeatureSet::toString(feature),
           "",
           std::string("Disable ") + description,
           ToolOptionsCategory,
           Arguments::Zero,
           [this, feature](Options*, const std::string&) {
             enabledFeatures.set(feature, false);
             disabledFeatures.set(feature, true);
           });
    return *this;
  }